

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void JS_DetachArrayBuffer(JSContext *ctx,JSValue obj)

{
  long lVar1;
  JSTypedArray *ta;
  undefined4 *puVar2;
  undefined4 *puVar3;
  
  if (((int)obj.tag == -1) && (*(short *)((long)obj.u.ptr + 6) == 0x13)) {
    puVar3 = *(undefined4 **)((long)obj.u.ptr + 0x30);
  }
  else {
    puVar3 = (undefined4 *)0x0;
  }
  if ((puVar3 != (undefined4 *)0x0) && (*(char *)(puVar3 + 1) == '\0')) {
    if (*(code **)(puVar3 + 10) != (code *)0x0) {
      (**(code **)(puVar3 + 10))(ctx->rt,*(undefined8 *)(puVar3 + 8),*(undefined8 *)(puVar3 + 2));
    }
    *(undefined8 *)(puVar3 + 2) = 0;
    *puVar3 = 0;
    *(undefined1 *)(puVar3 + 1) = 1;
    for (puVar2 = *(undefined4 **)(puVar3 + 6); puVar2 != puVar3 + 4;
        puVar2 = *(undefined4 **)(puVar2 + 2)) {
      lVar1 = *(long *)(puVar2 + 4);
      if (*(short *)(lVar1 + 6) != 0x1e) {
        *(undefined4 *)(lVar1 + 0x40) = 0;
        *(undefined8 *)(lVar1 + 0x38) = 0;
      }
    }
  }
  return;
}

Assistant:

void JS_DetachArrayBuffer(JSContext *ctx, JSValueConst obj)
{
    JSArrayBuffer *abuf = JS_GetOpaque(obj, JS_CLASS_ARRAY_BUFFER);
    struct list_head *el;

    if (!abuf || abuf->detached)
        return;
    if (abuf->free_func)
        abuf->free_func(ctx->rt, abuf->opaque, abuf->data);
    abuf->data = NULL;
    abuf->byte_length = 0;
    abuf->detached = TRUE;

    list_for_each(el, &abuf->array_list) {
        JSTypedArray *ta;
        JSObject *p;

        ta = list_entry(el, JSTypedArray, link);
        p = ta->obj;
        /* Note: the typed array length and offset fields are not modified */
        if (p->class_id != JS_CLASS_DATAVIEW) {
            p->u.array.count = 0;
            p->u.array.u.ptr = NULL;
        }
    }
}